

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ClipControlErrors::iterate(ClipControlErrors *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  TestContext *pTVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  MessageBuilder *pMVar6;
  long lVar7;
  GLenum local_1e8 [10];
  ClipControlApi cc;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
           )->m_log;
  iVar3 = (*((this->super_ClipControlBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  ClipControlApi::ClipControlApi
            (&cc,(this->super_ClipControlBaseTest).super_TestCase.m_context,
             (this->super_ClipControlBaseTest).m_api);
  local_1e8[0] = 0x8ca2;
  local_1e8[1] = 0;
  local_1e8[2] = 0x8ca1;
  local_1e8[3] = 0;
  local_1e8[4] = 0;
  local_1e8[5] = 0x935f;
  local_1e8[6] = 0;
  local_1e8[7] = 0x935e;
  local_1e8[8] = 0;
  local_1e8[9] = 0;
  this_00 = (ostringstream *)(local_1b0 + 8);
  for (lVar7 = 0; lVar7 != 0x28; lVar7 = lVar7 + 8) {
    (*cc.clipControl)(*(GLenum *)((long)local_1e8 + lVar7),*(GLenum *)((long)local_1e8 + lVar7 + 4))
    ;
    iVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    if (iVar4 != 0x500) {
      pTVar2 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx;
      pcVar5 = qpGetTestResultName(QP_TEST_RESULT_FAIL);
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,pcVar5);
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "ClipControl have not generated GL_INVALID_ENUM error when called with invalid value ("
                     );
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(uint *)((long)local_1e8 + lVar7));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)local_1e8 + lVar7 + 4));
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
  }
  pTVar2 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pcVar5 = qpGetTestResultName(QP_TEST_RESULT_PASS);
  tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_PASS,pcVar5);
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		/* API query */
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		/* Finding improper value. */
		GLenum improper_value = GL_NONE;

		while ((GL_UPPER_LEFT == improper_value) || (GL_LOWER_LEFT == improper_value) ||
			   (GL_ZERO_TO_ONE == improper_value) || (GL_NEGATIVE_ONE_TO_ONE == improper_value))
		{
			++improper_value;
		}

		/* Test setup. */
		GLenum cases[5][2] = { { GL_UPPER_LEFT, improper_value },
							   { GL_LOWER_LEFT, improper_value },
							   { improper_value, GL_ZERO_TO_ONE },
							   { improper_value, GL_NEGATIVE_ONE_TO_ONE },
							   { improper_value, improper_value } };

		/* Test iterations. */
		for (size_t i = 0; i < DE_LENGTH_OF_ARRAY(cases); i++)
		{
			cc.clipControl(cases[i][0], cases[i][1]);

			if (GL_INVALID_ENUM != gl.getError())
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, qpGetTestResultName(QP_TEST_RESULT_FAIL));

				log << tcu::TestLog::Message
					<< "ClipControl have not generated GL_INVALID_ENUM error when called with invalid value ("
					<< cases[i][0] << ", " << cases[i][1] << ")." << tcu::TestLog::EndMessage;
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, qpGetTestResultName(QP_TEST_RESULT_PASS));
		return STOP;
	}